

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

float vera::distance(vec3 *_point,Line *_line,vec3 *_closes_point)

{
  vec3 *pvVar1;
  float fVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec<3,_float,_(glm::qualifier)0> local_110;
  vec<3,_float,_(glm::qualifier)0> local_100;
  vec<3,_float,_(glm::qualifier)0> local_f0;
  vec<3,_float,_(glm::qualifier)0> local_e0;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  vec<3,_float,_(glm::qualifier)0> local_c4;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  vec<3,_float,_(glm::qualifier)0> local_98;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_78;
  undefined8 local_68;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_60;
  vec<3,_float,_(glm::qualifier)0> local_58;
  vec<3,_float,_(glm::qualifier)0> local_44;
  float local_38;
  float local_34;
  float s12;
  float m2;
  vec3 dx;
  vec3 *_closes_point_local;
  Line *_line_local;
  vec3 *_point_local;
  
  unique0x10000223 = _closes_point;
  pvVar1 = Line::getDireciton(_line);
  dx.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)&pvVar1->field_2;
  s12 = pvVar1->field_0;
  unique0x00012004 = pvVar1->field_1;
  local_34 = Line::getMagintude2(_line);
  pvVar1 = Line::operator[](_line,1);
  vVar3 = glm::operator-(pvVar1,_point);
  local_58._0_8_ = vVar3._0_8_;
  local_44.field_0 = local_58.field_0;
  local_44.field_1 = local_58.field_1;
  local_58.field_2 = vVar3.field_2;
  local_44.field_2 = local_58.field_2;
  local_58 = vVar3;
  local_38 = glm::dot<3,float,(glm::qualifier)0>(&local_44,(vec<3,_float,_(glm::qualifier)0> *)&s12)
  ;
  local_38 = local_38 / local_34;
  if (0.0 <= local_38) {
    if (1.0 < local_38) {
      local_38 = 1.0;
    }
  }
  else {
    local_38 = 0.0;
  }
  fVar2 = local_38;
  pvVar1 = Line::operator[](_line,0);
  vVar3 = glm::operator*(fVar2,pvVar1);
  local_88.field_2 = vVar3.field_2;
  local_78.field_2 = local_88.field_2;
  local_88._0_8_ = vVar3._0_8_;
  local_78.field_0 = local_88.field_0;
  local_78.field_1 = local_88.field_1;
  fVar2 = 1.0 - local_38;
  local_88 = vVar3;
  pvVar1 = Line::operator[](_line,1);
  vVar3 = glm::operator*(fVar2,pvVar1);
  local_a8.field_2 = vVar3.field_2;
  local_98.field_2 = local_a8.field_2;
  local_a8._0_8_ = vVar3._0_8_;
  local_98.field_0 = local_a8.field_0;
  local_98.field_1 = local_a8.field_1;
  local_a8 = vVar3;
  vVar3 = glm::operator+(&local_78,&local_98);
  fVar2 = local_38;
  local_b8.field_2 = vVar3.field_2;
  local_60 = local_b8.field_2;
  local_b8._0_8_ = vVar3._0_8_;
  local_68._0_4_ = local_b8.field_0;
  local_68._4_4_ = local_b8.field_1;
  stack0xffffffffffffffe0->field_2 = local_b8.field_2;
  stack0xffffffffffffffe0->field_0 = local_b8.field_0;
  stack0xffffffffffffffe0->field_1 = local_b8.field_1;
  local_b8 = vVar3;
  pvVar1 = Line::operator[](_line,0);
  vVar3 = glm::operator*(fVar2,pvVar1);
  local_e0.field_2 = vVar3.field_2;
  local_e0._0_8_ = vVar3._0_8_;
  fVar2 = 1.0 - local_38;
  local_d0._0_8_ = local_e0._0_8_;
  local_d0.field_2 = local_e0.field_2;
  pvVar1 = Line::operator[](_line,1);
  vVar3 = glm::operator*(fVar2,pvVar1);
  local_100.field_2 = vVar3.field_2;
  local_f0.field_2 = local_100.field_2;
  local_100._0_8_ = vVar3._0_8_;
  local_f0.field_0 = local_100.field_0;
  local_f0.field_1 = local_100.field_1;
  vVar3 = glm::operator+(&local_d0,&local_f0);
  local_110._0_8_ = vVar3._0_8_;
  local_c4.field_0 = local_110.field_0;
  local_c4.field_1 = local_110.field_1;
  local_110.field_2 = vVar3.field_2;
  local_c4.field_2 = local_110.field_2;
  fVar2 = glm::distance<3,float,(glm::qualifier)0>(_point,&local_c4);
  return fVar2;
}

Assistant:

float distance(const glm::vec3& _point, const Line& _line, glm::vec3& _closes_point) {
   glm::vec3 dx = _line.getDireciton();
   float m2 = _line.getMagintude2();

   // find parameter value of closest point on segment
   float s12 = glm::dot(_line[1]-_point, dx) / m2;

   if (s12 < 0)
      s12 = 0;
   else if(s12 > 1)
      s12 = 1;
   
   // and find the distance
   _closes_point = s12 * _line[0] + (1.0f - s12) * _line[1];
   return glm::distance(_point, s12 * _line[0] + (1.0f - s12) * _line[1]);
}